

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O1

REF_STATUS ref_edge_uniq(REF_EDGE ref_edge,REF_INT node0,REF_INT node1)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong in_RAX;
  REF_INT *pRVar5;
  int iVar6;
  long lVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  uVar3 = ref_edge_with(ref_edge,node0,node1,(REF_INT *)((long)&uStack_38 + 4));
  if ((uVar3 == 0) || (uVar3 == 5)) {
    if (uStack_38._4_4_ == -1) {
      iVar1 = ref_edge->max;
      if (iVar1 <= ref_edge->n) {
        iVar6 = 5000;
        if (5000 < (int)((double)iVar1 * 1.5)) {
          iVar6 = (int)((double)iVar1 * 1.5);
        }
        ref_edge->max = iVar6 + iVar1;
        fflush(_stdout);
        if (0 < ref_edge->max) {
          pRVar5 = (REF_INT *)realloc(ref_edge->e2n,(ulong)(uint)ref_edge->max << 3);
          ref_edge->e2n = pRVar5;
        }
        pRVar5 = ref_edge->e2n;
        if (pRVar5 == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 0x72,"ref_edge_uniq","realloc ref_edge->e2n NULL");
          uVar2 = (long)ref_edge->max * 2;
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar2 & 0xffffffff,uVar2
                 ,4,(long)ref_edge->max << 3);
          uVar3 = 2;
        }
        else {
          if (iVar1 < ref_edge->max) {
            lVar7 = (long)iVar1;
            do {
              (pRVar5 + lVar7 * 2)[0] = -1;
              (pRVar5 + lVar7 * 2)[1] = -1;
              lVar7 = lVar7 + 1;
            } while (lVar7 < ref_edge->max);
          }
          uStack_38 = uStack_38 & 0xffffffff;
        }
        if (pRVar5 == (REF_INT *)0x0) {
          return uVar3;
        }
      }
      iVar1 = ref_edge->n;
      uStack_38 = CONCAT44(iVar1,(undefined4)uStack_38);
      ref_edge->n = iVar1 + 1;
      pRVar5 = ref_edge->e2n;
      pRVar5[(long)iVar1 * 2] = node0;
      iVar6 = iVar1 * 2 + 1;
      pRVar5[iVar6] = node1;
      uVar3 = ref_adj_add(ref_edge->adj,node0,iVar1);
      if (uVar3 == 0) {
        uVar4 = ref_adj_add(ref_edge->adj,ref_edge->e2n[iVar6],iVar1);
        uVar3 = 0;
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 0x83,"ref_edge_uniq",(ulong)uVar4,"adj n1");
          uVar3 = uVar4;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x80
               ,"ref_edge_uniq",(ulong)uVar3,"adj n0");
      }
    }
    else {
      uVar3 = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x67,
           "ref_edge_uniq",(ulong)uVar3,"find existing");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_edge_uniq(REF_EDGE ref_edge, REF_INT node0,
                                 REF_INT node1) {
  REF_INT edge;

  /* do nothing if we already have it */
  RXS(ref_edge_with(ref_edge, node0, node1, &edge), REF_NOT_FOUND,
      "find existing");
  if (REF_EMPTY != edge) return REF_SUCCESS;

  /* incremental reallocation */
  if (ref_edge_n(ref_edge) >= ref_edge_max(ref_edge)) {
    REF_INT orig, chunk;
    orig = ref_edge_max(ref_edge);
    /* geometric growth for efficiency */
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_edge_max(ref_edge) = orig + chunk;

    ref_realloc(ref_edge->e2n, 2 * ref_edge_max(ref_edge), REF_INT);
    for (edge = orig; edge < ref_edge_max(ref_edge); edge++) {
      ref_edge_e2n(ref_edge, 0, edge) = REF_EMPTY;
      ref_edge_e2n(ref_edge, 1, edge) = REF_EMPTY;
    }
  }

  edge = ref_edge_n(ref_edge);
  ref_edge_n(ref_edge)++;
  ref_edge_e2n(ref_edge, 0, edge) = node0;
  ref_edge_e2n(ref_edge, 1, edge) = node1;

  RSS(ref_adj_add(ref_edge_adj(ref_edge), ref_edge_e2n(ref_edge, 0, edge),
                  edge),
      "adj n0");
  RSS(ref_adj_add(ref_edge_adj(ref_edge), ref_edge_e2n(ref_edge, 1, edge),
                  edge),
      "adj n1");

  return REF_SUCCESS;
}